

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::mapsEqual<CoreML::Specification::StringToDoubleMap>
               (StringToDoubleMap *a,StringToDoubleMap *b)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *pMVar5;
  const_reference key;
  double *pdVar6;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *__range2;
  StringToDoubleMap *b_local;
  StringToDoubleMap *a_local;
  
  iVar3 = StringToDoubleMap::map_size(a);
  iVar4 = StringToDoubleMap::map_size(b);
  if (iVar3 == iVar4) {
    pMVar5 = StringToDoubleMap::map_abi_cxx11_(a);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    begin((const_iterator *)&__end0.it_.bucket_index_,pMVar5);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    end((const_iterator *)&p,pMVar5);
    while (bVar2 = google::protobuf::operator!=
                             ((const_iterator *)&__end0.it_.bucket_index_,(const_iterator *)&p),
          bVar2) {
      key = google::protobuf::
            Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
            ::const_iterator::operator*((const_iterator *)&__end0.it_.bucket_index_);
      dVar1 = key->second;
      pMVar5 = StringToDoubleMap::map_abi_cxx11_(b);
      pdVar6 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               ::at(pMVar5,&key->first);
      if ((dVar1 != *pdVar6) || (NAN(dVar1) || NAN(*pdVar6))) {
        return false;
      }
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
      const_iterator::operator++((const_iterator *)&__end0.it_.bucket_index_);
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool mapsEqual(const T& a, const T& b) {
            if (a.map_size() != b.map_size()) {
                return false;
            }
            for (const auto& p : a.map()) {
                if (p.second != b.map().at(p.first)) {
                    return false;
                }
            }
            return true;
        }